

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
o4_roots<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                Matrix<double,_5,_1,_0,_5,_1> *p)

{
  iterator iVar1;
  undefined1 auVar2 [16];
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  complex<double> P;
  complex<double> Q;
  complex<double> R;
  double local_c0;
  undefined1 local_b8 [16];
  double local_a0;
  double local_98;
  ulong uStack_90;
  double local_80;
  double local_78;
  ulong uStack_70;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  double local_30 [2];
  undefined1 local_20 [16];
  
  local_b8._8_8_ = local_b8._0_8_;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = (p->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
             array[0];
  local_a0 = (p->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
             array[1];
  dVar6 = (p->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.array
          [2];
  dVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.array
          [3];
  dVar9 = local_48 * local_48;
  dVar4 = local_a0 * local_a0;
  dVar8 = local_48 * dVar9;
  local_68._0_8_ = dVar6 / local_48 - (dVar4 * 3.0) / (dVar9 * 8.0);
  local_80 = dVar5 / local_48 +
             ((local_a0 * dVar4) / (dVar8 * 8.0) - (local_a0 * dVar6) / (dVar9 + dVar9));
  uVar7 = 0;
  dVar6 = (p->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.array
          [4] / local_48 +
          (local_a0 * dVar5) / (dVar9 * -4.0) +
          (dVar4 * dVar6) / (dVar8 * 16.0) +
          (local_a0 * local_a0 * dVar4 * 3.0) / (local_48 * dVar8 * -256.0);
  dVar5 = ((double)local_68._0_8_ * (double)local_68._0_8_) / -12.0 - dVar6;
  local_50 = 0.0;
  local_68._8_8_ = 0;
  local_98 = local_80 * local_80 * -0.125 +
             (dVar6 * (double)local_68._0_8_) / 3.0 +
             ((double)local_68._0_8_ * (double)local_68._0_8_ * (double)local_68._0_8_) / -108.0;
  local_30[1] = 0.0;
  local_c0 = 2.0;
  local_58 = dVar5;
  local_30[0] = local_98;
  std::pow<double>((complex<double> *)local_30,&local_c0);
  local_b8._0_8_ = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_38 = 3.0;
  local_78 = dVar5;
  std::pow<double>((complex<double> *)&local_58,&local_38);
  local_98 = local_98 * 0.5;
  dVar6 = dVar5 / 27.0 + local_78 * 0.25;
  local_20._0_8_ =
       csqrt((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) / 27.0 +
             (double)local_b8._0_8_ * 0.25);
  local_20._0_8_ = (double)local_20._0_8_ - local_98;
  local_c0 = 0.3333333333333333;
  local_20._8_8_ = dVar6;
  std::pow<double>((complex<double> *)local_20,&local_c0);
  if (((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) != 0.0) ||
     (NAN((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)))) {
    local_b8._0_8_ = ((double)local_68._0_8_ * -5.0) / 6.0;
    local_98 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    uStack_70 = uVar7;
    local_78 = dVar6;
    dVar5 = local_50;
    dVar6 = (double)__divdc3(SUB84(local_58,0),local_50,
                             SUB84((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * 3.0,0
                                  ),dVar6 * 3.0);
    dVar9 = ((double)local_b8._0_8_ - dVar6) + local_98;
    dVar6 = local_78 - dVar5;
    auVar2._8_4_ = local_78._8_4_;
    auVar2._0_8_ = dVar6;
    auVar2._12_4_ = local_78._12_4_;
    uStack_70 = auVar2._8_8_;
    uVar7 = uStack_70;
  }
  else {
    local_c0 = 0.3333333333333333;
    std::pow<double>((complex<double> *)local_30,&local_c0);
    dVar6 = -dVar6;
    dVar9 = (local_68._0_8_ * -5.0) / 6.0 -
            (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    uVar7 = uVar7 ^ 0x8000000000000000;
  }
  local_b8._0_8_ = dVar9 + dVar9;
  dVar6 = dVar6 + dVar6;
  uStack_70 = uVar7;
  local_78 = dVar6;
  dVar5 = csqrt((double)CONCAT44(local_68._4_4_,local_68._0_4_) + dVar9 + dVar9);
  local_a0 = local_a0 / (local_48 * -4.0);
  uVar3 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 3.0 + (double)local_b8._0_8_;
  local_68._12_4_ = uVar3;
  local_80 = local_80 + local_80;
  dVar9 = 0.0;
  local_b8._8_4_ = extraout_XMM0_Dc;
  local_b8._0_8_ = dVar5;
  local_b8._12_4_ = extraout_XMM0_Dd;
  local_98 = dVar6;
  uStack_90 = uVar7;
  dVar6 = (double)__divdc3();
  dVar5 = -(dVar9 + local_78);
  dVar6 = csqrt(-(dVar6 + (double)local_68._0_8_));
  if (ABS((dVar5 + local_98) * 0.5) < 1e-06) {
    local_c0 = (double)(float)((dVar6 + (double)local_b8._0_8_) * 0.5 + local_a0);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar1,&local_c0);
    }
    else {
      *iVar1._M_current = local_c0;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  dVar5 = 0.0;
  dVar6 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_,local_98);
  dVar5 = -(dVar5 + local_78);
  dVar6 = csqrt(-(dVar6 + (double)local_68._0_8_));
  if (ABS((local_98 - dVar5) * 0.5) < 1e-06) {
    local_c0 = (double)(float)(((double)local_b8._0_8_ - dVar6) * 0.5 + local_a0);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar1,&local_c0);
    }
    else {
      *iVar1._M_current = local_c0;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  dVar5 = 0.0;
  dVar6 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_,local_98);
  dVar5 = -(local_78 - dVar5);
  dVar6 = csqrt(-((double)local_68._0_8_ - dVar6));
  if (ABS((dVar5 - local_98) * 0.5) < 1e-06) {
    local_c0 = (double)(float)((dVar6 - (double)local_b8._0_8_) * 0.5 + local_a0);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar1,&local_c0);
    }
    else {
      *iVar1._M_current = local_c0;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_48 = -local_98;
  uStack_40 = uStack_90 ^ 0x8000000000000000;
  dVar5 = 0.0;
  dVar6 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_);
  dVar5 = -(local_78 - dVar5);
  dVar6 = csqrt(-((double)local_68._0_8_ - dVar6));
  if (ABS((local_48 - dVar5) * 0.5) < 1e-06) {
    local_c0 = (double)(float)(local_a0 + (-(double)local_b8._0_8_ - dVar6) * 0.5);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar1,&local_c0);
    }
    else {
      *iVar1._M_current = local_c0;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<floatPrec> o4_roots(const Matrix<floatPrec, 5, 1> &p)
{

  vector<floatPrec> realRoots;
  complex<double> temp;

  double A = (double)p(0, 0);
  double B = (double)p(1, 0);
  double C = (double)p(2, 0);
  double D = (double)p(3, 0);
  double E = (double)p(4, 0);

  double A_pw2 = A * A;
  double B_pw2 = B * B;
  double A_pw3 = A_pw2 * A;
  double B_pw3 = B_pw2 * B;
  double A_pw4 = A_pw3 * A;
  double B_pw4 = B_pw3 * B;

  double alpha = -3 * B_pw2 / (8 * A_pw2) + C / A;
  double beta = B_pw3 / (8 * A_pw3) - B * C / (2 * A_pw2) + D / A;
  double gamma = -3 * B_pw4 / (256 * A_pw4) + B_pw2 * C / (16 * A_pw3) - B * D / (4 * A_pw2) + E / A;

  double alpha_pw2 = alpha * alpha;
  double alpha_pw3 = alpha_pw2 * alpha;

  complex<double> P(-alpha_pw2 / 12.0 - gamma, 0);
  complex<double> Q(-alpha_pw3 / 108.0 + alpha * gamma / 3 - pow(beta, 2) / 8, 0);
  complex<double> R = -Q / 2.0 + sqrt(pow(Q, 2.0) / 4.0 + pow(P, 3.0) / 27.0);

  complex<double> U = pow(R, (1.0 / 3.0));
  complex<double> y;

  if (U.real() == 0)
    y = -5.0 * alpha / 6.0 - pow(Q, (1.0 / 3.0));
  else
    y = -5.0 * alpha / 6.0 - P / (3.0 * U) + U;

  complex<double> w = sqrt(alpha + 2.0 * y);

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w + sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w - sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w + sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w - sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  return realRoots;
}